

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *this,
          SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *other)

{
  Phi *pPVar1;
  Phi *pPVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size);
    if ((other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size == 0) {
      uVar5 = 0;
    }
    else {
      lVar3 = 0;
      uVar4 = 0;
      do {
        pPVar1 = (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr;
        pPVar2 = (other->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr;
        *(undefined4 *)((long)&(pPVar1->function_variable).id + lVar3) =
             *(undefined4 *)((long)&(pPVar2->function_variable).id + lVar3);
        *(undefined8 *)((long)&(pPVar1->local_variable).id + lVar3) =
             *(undefined8 *)((long)&(pPVar2->local_variable).id + lVar3);
        uVar4 = uVar4 + 1;
        uVar5 = (other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < uVar5);
    }
    (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size = uVar5;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}